

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_alloc.c
# Opt level: O3

void * ngx_alloc(size_t size,ngx_log_t *log)

{
  void *pvVar1;
  int *piVar2;
  ulong uVar3;
  
  pvVar1 = malloc(size);
  uVar3 = log->log_level;
  if (pvVar1 == (void *)0x0) {
    if (uVar3 == 0) {
      return (void *)0x0;
    }
    piVar2 = __errno_location();
    ngx_log_error_core(1,log,*piVar2,"malloc(%uz) failed",size);
    uVar3 = log->log_level;
  }
  if ((uVar3 & 0x20) != 0) {
    ngx_log_error_core(8,log,0,"malloc: %p:%uz",pvVar1,size);
  }
  return pvVar1;
}

Assistant:

void *
ngx_alloc(size_t size, ngx_log_t *log)
{
    void  *p;

    p = malloc(size);
    if (p == NULL) {
        ngx_log_error(NGX_LOG_EMERG, log, ngx_errno,
                      "malloc(%uz) failed", size);
    }

    ngx_log_debug2(NGX_LOG_DEBUG_ALLOC, log, 0, "malloc: %p:%uz", p, size);

    return p;
}